

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall
ON_HistoryRecord::SetGeometryValue(ON_HistoryRecord *this,int value_id,ON_Geometry *g)

{
  bool bVar1;
  ON_SimpleArray<ON_Geometry_*> OStack_58;
  ON_SimpleArray<ON_Geometry_*> a;
  ON_Geometry *g_local;
  
  g_local = g;
  ON_SimpleArray<ON_Geometry_*>::ON_SimpleArray(&a,1);
  ON_SimpleArray<ON_Geometry_*>::Append(&a,&g_local);
  ON_SimpleArray<ON_Geometry_*>::ON_SimpleArray(&OStack_58,&a);
  bVar1 = SetGeometryValues(this,value_id,&OStack_58);
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&OStack_58);
  ON_SimpleArray<ON_Geometry_*>::~ON_SimpleArray(&a);
  return bVar1;
}

Assistant:

bool ON_HistoryRecord::SetGeometryValue( int value_id, ON_Geometry* g)
{
  ON_SimpleArray<ON_Geometry*> a(1);
  a.Append(g);
  return SetGeometryValues(value_id, a);
}